

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O1

bool compareTwoLibrary(library *a,library *b)

{
  library *plVar1;
  
  plVar1 = a;
  if (b->signupProcess < a->signupProcess) {
    plVar1 = b;
    b = a;
  }
  return b->shipTime < plVar1->shipTime;
}

Assistant:

bool compareTwoLibrary(library a, library b)
{
    // If total marks are not same then
    // returns true for higher total
    if (a.noOfBooks < b.noOfBooks )
    {
        if (a.signupProcess > b.signupProcess)
        {
            if(a.shipTime < b.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if(b.shipTime < a.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
    }
    else
    {
        if (a.signupProcess > b.signupProcess)
        {
            if(a.shipTime < b.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            if(b.shipTime < a.shipTime)
            {
                return true;
            }
            else
            {
                return false;
            }
        }
    }
}